

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O3

void make_blinded(long xtime,boolean talk)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  boolean bVar4;
  char *pcVar5;
  long lVar6;
  char *line;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  char buf [256];
  char local_138 [264];
  
  uVar2 = u.uprops[0x1e].intrinsic;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021c485;
    bVar8 = true;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021c480;
LAB_0021c48d:
    bVar3 = 1;
    if (xtime == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) goto LAB_0021c4d7;
      bVar1 = 0;
    }
    else {
LAB_0021c4ed:
      bVar1 = bVar3;
      if (ublindf == (obj *)0x0) {
        bVar9 = false;
        goto LAB_0021c4ff;
      }
    }
    bVar9 = ublindf->oartifact == '\x1d';
  }
  else {
LAB_0021c480:
    if (ublindf != (obj *)0x0) {
LAB_0021c485:
      bVar8 = ublindf->oartifact == '\x1d';
      goto LAB_0021c48d;
    }
    bVar1 = 1;
    bVar8 = false;
    bVar9 = false;
    if (xtime == 0) {
LAB_0021c4d7:
      bVar9 = true;
      bVar1 = 0;
      bVar3 = 0;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021c4ed;
    }
  }
LAB_0021c4ff:
  if (u.usleep != 0) {
    talk = '\0';
  }
  if ((bVar9 == false) || (bVar8 != false)) {
    if (!(bool)(u.uprops[0x1e].intrinsic == 0 | bVar1 | talk == '\0')) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          pcVar7 = "normal";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar7 = "sadder";
            }
            else {
              bVar4 = dmgtype(youmonst.data,0x24);
              pcVar7 = "normal";
              if (bVar4 == '\0') {
                pcVar7 = "sadder";
              }
            }
          }
          line = "Your vision seems to %s for a moment but is %s now.";
          pcVar5 = "brighten";
        }
        else {
          pcVar7 = body_part(1);
          strcpy(local_138,pcVar7);
          if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
             (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
            pcVar7 = "twitches";
            pcVar5 = local_138;
          }
          else {
            pcVar5 = makeplural(local_138);
            pcVar7 = "twitch";
          }
          pcVar7 = pcVar7 + 2;
          line = "Your %s momentarily %s.";
        }
        pline(line,pcVar5,pcVar7);
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
    if ((bVar8 != false) && (bVar9 == false)) {
      if (talk != '\0') {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((pcVar7 = "Oh, bummer!  Everything is dark!  Help!", u.umonnum != u.umonster &&
            (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
          pcVar7 = "A cloud of darkness falls upon you.";
        }
        pline(pcVar7);
      }
      bVar8 = true;
      if (uball != (obj *)0x0) {
        set_bc(0);
      }
      goto LAB_0021c81e;
    }
  }
  else {
    if (talk == '\0') {
      bVar8 = false;
      goto LAB_0021c81e;
    }
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((pcVar7 = "Far out!  Everything is all cosmic again!", u.umonnum != u.umonster &&
        (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
      pcVar7 = "You can see again.";
    }
    pline(pcVar7);
    bVar8 = false;
  }
  if ((bool)(bVar1 & uVar2 == 0 & talk != '\0')) {
    if (((youmonst.data)->mflags1 & 0x1000) == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        pcVar7 = "normal";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar7 = "happier";
          }
          else {
            bVar4 = dmgtype(youmonst.data,0x24);
            pcVar7 = "normal";
            if (bVar4 == '\0') {
              pcVar7 = "happier";
            }
          }
        }
        pline("Your vision seems to %s for a moment but is %s now.","dim",pcVar7);
      }
      else {
        pcVar5 = body_part(1);
        pcVar7 = local_138;
        strcpy(pcVar7,pcVar5);
        if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
           (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
          pcVar5 = "twitches";
        }
        else {
          pcVar7 = makeplural(local_138);
          pcVar5 = "twitch";
        }
        pline("Your %s momentarily %s.",pcVar7,pcVar5);
      }
    }
    else {
      strange_feeling((obj *)0x0,(char *)0x0);
    }
  }
LAB_0021c81e:
  lVar6 = 0;
  if (0 < xtime) {
    lVar6 = xtime;
  }
  if (0xfffffe < lVar6) {
    lVar6 = 0xffffff;
  }
  u.uprops[0x1e].intrinsic = (uint)lVar6 | u.uprops[0x1e].intrinsic & 0xff000000;
  if (bVar8 != bVar9) {
    iflags.botl = '\x01';
    vision_full_recalc = '\x01';
    if ((((((youmonst.data == mons + 0x32 ||
            (youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) &&
           u.uprops[0x19].blocked == 0) || (u.uprops[0x40].intrinsic != 0)) ||
        (u.uprops[0x40].extrinsic != 0)) || (((youmonst.data)->mflags3 & 0x100) != 0)) {
      see_monsters();
    }
  }
  return;
}

Assistant:

void make_blinded(long xtime, boolean talk)
{
	long old = Blinded;
	boolean u_could_see, can_see_now;
	int eyecnt;
	char buf[BUFSZ];

	/* we need to probe ahead in case the Eyes of the Overworld
	   are or will be overriding blindness */
	u_could_see = !Blind;
	Blinded = xtime ? 1L : 0L;
	can_see_now = !Blind;
	Blinded = old;		/* restore */

	if (u.usleep) talk = FALSE;

	if (can_see_now && !u_could_see) {	/* regaining sight */
	    if (talk) {
		if (Hallucination)
		    pline("Far out!  Everything is all cosmic again!");
		else
		    pline("You can see again.");
	    }
	} else if (old && !xtime) {
	    /* clearing temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "brighten",
			 Hallucination ? "sadder" : "normal");
		}
	    }
	}

	if (u_could_see && !can_see_now) {	/* losing sight */
	    if (talk) {
		if (Hallucination)
		    pline("Oh, bummer!  Everything is dark!  Help!");
		else
		    pline("A cloud of darkness falls upon you.");
	    }
	    /* Before the hero goes blind, set the ball&chain variables. */
	    if (Punished) set_bc(0);
	} else if (!old && xtime) {
	    /* setting temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "twitches" : "twitch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "dim",
			 Hallucination ? "happier" : "normal");
		}
	    }
	}

	set_itimeout(&Blinded, xtime);

	if (u_could_see ^ can_see_now) {  /* one or the other but not both */
	    iflags.botl = 1;
	    vision_full_recalc = 1;	/* blindness just got toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	}
}